

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationData::getLastPrimaryForGroup(CollationData *this,int32_t script)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = getScriptIndex(this,script);
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)this->scriptStarts[(ulong)uVar1 + 1] * 0x10000 - 1;
  }
  return uVar2;
}

Assistant:

uint32_t
CollationData::getLastPrimaryForGroup(int32_t script) const {
    int32_t index = getScriptIndex(script);
    if(index == 0) {
        return 0;
    }
    uint32_t limit = scriptStarts[index + 1];
    return (limit << 16) - 1;
}